

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

arith_uint256 * __thiscall
arith_uint256::SetCompact(arith_uint256 *this,uint32_t nCompact,bool *pfNegative,bool *pfOverflow)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = nCompact & 0x7fffff;
  if (nCompact < 0x4000000) {
    uVar3 = uVar3 >> (0x18U - (char)((nCompact >> 0x18) << 3) & 0x1f);
    (this->super_base_uint<256U>).pn[0] = uVar3;
    (this->super_base_uint<256U>).pn[1] = 0;
    (this->super_base_uint<256U>).pn[2] = 0;
    (this->super_base_uint<256U>).pn[3] = 0;
    (this->super_base_uint<256U>).pn[4] = 0;
    (this->super_base_uint<256U>).pn[4] = 0;
    (this->super_base_uint<256U>).pn[5] = 0;
    (this->super_base_uint<256U>).pn[6] = 0;
    (this->super_base_uint<256U>).pn[7] = 0;
  }
  else {
    (this->super_base_uint<256U>).pn[0] = uVar3;
    (this->super_base_uint<256U>).pn[1] = 0;
    (this->super_base_uint<256U>).pn[2] = 0;
    (this->super_base_uint<256U>).pn[3] = 0;
    (this->super_base_uint<256U>).pn[4] = 0;
    (this->super_base_uint<256U>).pn[4] = 0;
    (this->super_base_uint<256U>).pn[5] = 0;
    (this->super_base_uint<256U>).pn[6] = 0;
    (this->super_base_uint<256U>).pn[7] = 0;
    base_uint<256U>::operator<<=(&this->super_base_uint<256U>,(nCompact >> 0x18) * 8 - 0x18);
  }
  if (pfNegative != (bool *)0x0) {
    *pfNegative = (bool)((byte)(nCompact >> 0x17) & uVar3 != 0);
  }
  if (pfOverflow != (bool *)0x0) {
    if (uVar3 == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if ((nCompact < 0x23000000) && ((nCompact < 0x22000000 || (uVar3 < 0x100)))) {
        bVar2 = 0x20ffffff < nCompact && 0xffff < uVar3;
      }
    }
    *pfOverflow = bVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256& arith_uint256::SetCompact(uint32_t nCompact, bool* pfNegative, bool* pfOverflow)
{
    int nSize = nCompact >> 24;
    uint32_t nWord = nCompact & 0x007fffff;
    if (nSize <= 3) {
        nWord >>= 8 * (3 - nSize);
        *this = nWord;
    } else {
        *this = nWord;
        *this <<= 8 * (nSize - 3);
    }
    if (pfNegative)
        *pfNegative = nWord != 0 && (nCompact & 0x00800000) != 0;
    if (pfOverflow)
        *pfOverflow = nWord != 0 && ((nSize > 34) ||
                                     (nWord > 0xff && nSize > 33) ||
                                     (nWord > 0xffff && nSize > 32));
    return *this;
}